

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GeneratePolicyHeaderCode(cmExportFileGenerator *this,ostream *os)

{
  ostream *poVar1;
  
  std::operator<<(os,"# Generated by CMake\n\n");
  poVar1 = std::operator<<(os,"if(\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" LESS 2.5)\n");
  poVar1 = std::operator<<(poVar1,"   message(FATAL_ERROR \"CMake >= 2.6.0 required\")\n");
  std::operator<<(poVar1,"endif()\n");
  poVar1 = std::operator<<(os,"cmake_policy(PUSH)\n");
  std::operator<<(poVar1,"cmake_policy(VERSION 2.6)\n");
  return;
}

Assistant:

void cmExportFileGenerator::GeneratePolicyHeaderCode(std::ostream& os)
{
  // Protect that file against use with older CMake versions.
  /* clang-format off */
  os << "# Generated by CMake\n\n";
  os << "if(\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" LESS 2.5)\n"
     << "   message(FATAL_ERROR \"CMake >= 2.6.0 required\")\n"
     << "endif()\n";
  /* clang-format on */

  // Isolate the file policy level.
  // We use 2.6 here instead of the current version because newer
  // versions of CMake should be able to export files imported by 2.6
  // until the import format changes.
  /* clang-format off */
  os << "cmake_policy(PUSH)\n"
     << "cmake_policy(VERSION 2.6)\n";
  /* clang-format on */
}